

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O0

void CalculateNormals(SIBMesh *mesh)

{
  uint uVar1;
  uint uVar2;
  pointer __n;
  reference pvVar3;
  float *pfVar4;
  reference pvVar5;
  reference v2;
  aiVector3t<float> aVar6;
  aiVector3D aVar7;
  aiVector3D vtxNorm;
  uint32_t nrm;
  uint32_t pos;
  uint32_t i_1;
  uint32_t numPoints_1;
  uint32_t *idx_1;
  size_t faceIdx_1;
  aiVector3t<float> local_90;
  float *local_80;
  uint32_t *next;
  float *pfStack_70;
  uint32_t i;
  uint32_t *prev;
  aiVector3D faceNormal;
  uint32_t numPoints;
  uint32_t *idx;
  size_t faceIdx;
  allocator<aiVector3t<float>_> local_31;
  undefined1 local_30 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> faceNormals;
  size_t numFaces;
  SIBMesh *mesh_local;
  
  __n = (pointer)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&mesh->faceStart);
  faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __n;
  std::allocator<aiVector3t<float>_>::allocator(&local_31);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30,
             (size_type)__n,&local_31);
  std::allocator<aiVector3t<float>_>::~allocator(&local_31);
  for (idx = (uint32_t *)0x0;
      idx < faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage; idx = (uint32_t *)((long)idx + 1)) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&mesh->faceStart,(size_type)idx);
    pfVar4 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                (&mesh->idx,(ulong)*pvVar3);
    register0x00000008 = pfVar4 + 1;
    faceNormal.y = *pfVar4;
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&prev,0.0,0.0,0.0);
    pfStack_70 = stack0xffffffffffffffa8 + (uint)(((int)faceNormal.y + -1) * 3);
    for (next._4_4_ = 0.0; (uint)next._4_4_ < (uint)faceNormal.y;
        next._4_4_ = (float)((int)next._4_4_ + 1)) {
      local_80 = stack0xffffffffffffffa8 + (uint)((int)next._4_4_ * 3);
      pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (&mesh->pos,(ulong)(uint)*pfStack_70);
      v2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                     (&mesh->pos,(ulong)(uint)*local_80);
      aVar6 = operator^(pvVar5,v2);
      local_90.z = aVar6.z;
      local_90._0_8_ = aVar6._0_8_;
      aiVector3t<float>::operator+=((aiVector3t<float> *)&prev,&local_90);
      pfStack_70 = local_80;
    }
    pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30,
                        (size_type)idx);
    *(uint32_t **)pvVar5 = prev;
    pvVar5->z = faceNormal.x;
  }
  for (idx_1 = (uint32_t *)0x0;
      idx_1 < faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      idx_1 = (uint32_t *)((long)idx_1 + 1)) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&mesh->faceStart,(size_type)idx_1);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&mesh->idx,(ulong)*pvVar3);
    uVar1 = *pvVar3;
    for (nrm = 0; nrm < uVar1; nrm = nrm + 1) {
      uVar2 = pvVar3[(ulong)(nrm * 3 + 1) + 1];
      aVar7 = CalculateVertexNormal
                        (mesh,(uint32_t)idx_1,pvVar3[(ulong)(nrm * 3) + 1],
                         (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30)
      ;
      pvVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                         (&mesh->nrm,(ulong)uVar2);
      pvVar5->x = (float)(int)aVar7._0_8_;
      pvVar5->y = (float)(int)((ulong)aVar7._0_8_ >> 0x20);
      pvVar5->z = aVar7.z;
    }
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_30);
  return;
}

Assistant:

static void CalculateNormals(SIBMesh* mesh)
{
    size_t numFaces = mesh->faceStart.size();

    // Calculate face normals.
    std::vector<aiVector3D> faceNormals(numFaces);
    for (size_t faceIdx=0;faceIdx<numFaces;faceIdx++)
    {
        uint32_t* idx = &mesh->idx[mesh->faceStart[faceIdx]];
        uint32_t numPoints = *idx++;

        aiVector3D faceNormal(0, 0, 0);

        uint32_t *prev = &idx[(numPoints-1)*N];

        for (uint32_t i=0;i<numPoints;i++)
        {
            uint32_t *next = &idx[i*N];

            faceNormal += mesh->pos[prev[POS]] ^ mesh->pos[next[POS]];
            prev = next;
        }

        faceNormals[faceIdx] = faceNormal;
    }

    // Calculate vertex normals.
    for (size_t faceIdx=0;faceIdx<numFaces;faceIdx++)
    {
        uint32_t* idx = &mesh->idx[mesh->faceStart[faceIdx]];
        uint32_t numPoints = *idx++;

        for (uint32_t i=0;i<numPoints;i++)
        {
            uint32_t pos = idx[i*N+POS];
            uint32_t nrm = idx[i*N+NRM];
            aiVector3D vtxNorm = CalculateVertexNormal(mesh, static_cast<uint32_t>(faceIdx), pos, faceNormals);
            mesh->nrm[nrm] = vtxNorm;
        }
    }
}